

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.hpp
# Opt level: O2

bool udpdiscovery::impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
               (SerializeDirection direction,uint *value,BufferView *buffer_view)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = true;
  if (direction == kParse) {
    *value = 0;
    if ((int)buffer_view->buffer_->_M_string_length < buffer_view->parsed_ + 4) {
      bVar2 = false;
    }
    else {
      for (iVar3 = 0x18; iVar3 != -8; iVar3 = iVar3 + -8) {
        bVar1 = BufferView::Read(buffer_view);
        *value = *value | (uint)bVar1 << ((byte)iVar3 & 0x1f);
      }
    }
  }
  else if (direction == kSerialize) {
    bVar1 = 0x18;
    for (iVar3 = -4; iVar3 != 0; iVar3 = iVar3 + 1) {
      BufferView::push_back(buffer_view,(char)(*value >> (bVar1 & 0x1f)));
      bVar1 = bVar1 - 8;
    }
  }
  return bVar2;
}

Assistant:

bool SerializeUnsignedIntegerBigEndian(SerializeDirection direction,
                                       ValueType* value,
                                       BufferView* buffer_view) {
  switch (direction) {
    case kSerialize: {
      int n = sizeof(ValueType);
      for (int i = 0; i < n; ++i) {
        uint8_t c = (uint8_t)((*value) >> ((n - i - 1) * 8)) & 0xff;
        buffer_view->push_back(c);
      }
    } break;

    case kParse:
      *value = 0;
      if (buffer_view->CanRead(sizeof(ValueType))) {
        int n = sizeof(ValueType);
        for (int i = 0; i < n; ++i) {
          ValueType v = (uint8_t)buffer_view->Read();
          *value |= (v << ((n - i - 1) * 8));
        }
      } else {
        return false;
      }
      break;
  }

  return true;
}